

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenUtilsEM64T.hpp
# Opt level: O0

void Centaurus::push_arg<asmjit::X86Gp,int,asmjit::X86Gp,asmjit::X86Gp>
               (X86Assembler *as,X86Gp *arg1,int args,X86Gp *args_1,X86Gp *args_2)

{
  undefined8 this;
  anon_union_16_7_ed616b9d_for_Operand__0 local_f0;
  X86Gp *local_e0;
  X86Gp *args_local_2;
  X86Gp *args_local_1;
  X86Gp *pXStack_c8;
  int args_local;
  X86Gp *arg1_local;
  X86Assembler *as_local;
  X86Gp *local_b0;
  X86Gp *local_a8;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_a0;
  X86Gp *local_98;
  undefined1 *local_90;
  X86Gp *local_88;
  undefined1 *local_80;
  X86Gp *local_78;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_70;
  X86Gp *local_68;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_60;
  X86Gp *local_58;
  undefined1 *local_50;
  X86Gp *local_48;
  undefined1 *local_40;
  X86Gp *local_38;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_30;
  X86Gp *local_28;
  anon_union_16_7_ed616b9d_for_Operand__0 *local_20;
  X86Gp *local_18;
  undefined1 *local_10;
  
  local_a0 = &local_f0;
  local_f0._packed[0].field_10 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_f0._mem.field_2 =
       (args_1->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._mem.field_2;
  local_90 = &stack0xffffffffffffff00;
  this = (args_2->super_X86Reg).super_Reg.super_Operand.super_Operand_.field_0._packed[0];
  local_e0 = args_2;
  args_local_2 = args_1;
  args_local_1._4_4_ = args;
  pXStack_c8 = arg1;
  arg1_local = (X86Gp *)as;
  local_a8 = args_1;
  local_98 = args_2;
  local_88 = args_2;
  local_80 = local_90;
  local_78 = args_1;
  local_70 = local_a0;
  local_68 = args_1;
  local_60 = local_a0;
  local_58 = args_2;
  local_50 = local_90;
  local_48 = args_2;
  local_40 = local_90;
  local_38 = args_1;
  local_30 = local_a0;
  local_28 = args_1;
  local_20 = local_a0;
  local_18 = args_2;
  local_10 = local_90;
  push_arg<int,asmjit::X86Gp,asmjit::X86Gp>
            (as,args,(X86Gp *)&local_f0._any,(X86Gp *)&stack0xffffffffffffff00);
  local_b0 = arg1_local;
  as_local = (X86Assembler *)arg1;
  asmjit::CodeEmitter::emit
            ((CodeEmitter *)this,(uint32_t)((ulong)arg1 >> 0x20),(Operand_ *)0x15a7ba);
  return;
}

Assistant:

static void push_arg(asmjit::X86Assembler& as, T1 arg1, Ts... args)
{
	push_arg(as, args...);
	as.push(arg1);
}